

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O2

TestStatus *
vkt::pipeline::anon_unknown_0::testRenderToMipMaps
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict *caseDef)

{
  VkImageCreateFlags VVar1;
  VkFormat format_00;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  TestLog *log;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  undefined1 auVar3 [16];
  pointer pVVar4;
  Handle<(vk::HandleType)9> image;
  pointer imageSetDesc;
  Handle<(vk::HandleType)9> image_00;
  Handle<(vk::HandleType)16> pipelineLayout;
  Handle<(vk::HandleType)14> fragmentModule;
  Handle<(vk::HandleType)14> vertexModule;
  bool bVar5;
  deUint32 queueFamilyIndex;
  int iVar6;
  VkResult VVar7;
  deUint32 dVar8;
  VkImageAspectFlags VVar9;
  ChannelOrder CVar10;
  DeviceInterface *pDVar11;
  InstanceInterface *vki;
  VkDevice device;
  VkPhysicalDevice physDevice;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat TVar12;
  pointer puVar13;
  ProgramBinary *pPVar14;
  VkDevice device_00;
  VkQueue queue_00;
  NotSupportedError *this;
  VkImageCreateFlags flags;
  VkPrimitiveTopology numLayers;
  VkPrimitiveTopology VVar15;
  ulong uVar16;
  pointer pVVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  Context *this_00;
  VkImageType imageType;
  VkImageViewType viewType;
  byte bVar21;
  VkPipeline basePipeline;
  size_t sVar22;
  VkPrimitiveTopology VVar23;
  ulong uVar24;
  undefined4 uVar25;
  deUint32 numMipLevels;
  undefined1 useStencil;
  undefined7 uVar26;
  TextureLevel textureLevel;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  ConstPixelBufferAccess resultImage;
  Vector<int,_4> local_390;
  Context *local_380;
  ulong local_378;
  IVec4 imageSize;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> mipLevelSizes;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  RefBase<vk::VkCommandBuffer_s_*> local_328;
  Move<vk::Handle<(vk::HandleType)9>_> colorImage;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  undefined8 local_2c0;
  VkImageSubresourceRange res_1;
  VkImageSubresourceRange res;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> regions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mipLevelStorageSizes;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  Move<vk::Handle<(vk::HandleType)9>_> depthStencilImage;
  string local_208;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> clearValues;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_198;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  depthStencilAttachments;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> depthStencilImageAlloc;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  deUint64 local_e0;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_d8;
  TextureFormat format;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_98;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_78;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_58;
  
  checkImageViewTypeRequirements(context,caseDef->viewType);
  pDVar11 = Context::getDeviceInterface(context);
  useStencil = SUB81(pDVar11,0);
  uVar26 = (undefined7)((ulong)pDVar11 >> 8);
  vki = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  physDevice = Context::getPhysicalDevice(context);
  queue = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  tcu::Vector<int,_4>::Vector(&imageSize,&caseDef->imageSizeHint);
  dVar8 = imageSize.m_data[3];
  if (imageSize.m_data[3] < imageSize.m_data[2]) {
    dVar8 = imageSize.m_data[2];
  }
  tcu::Vector<int,_4>::Vector(&local_390,&imageSize);
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
            (&mipLevelSizes,&local_390);
  while ((local_390.m_data[0] != 1 || (local_390.m_data[2] != 1 || local_390.m_data[1] != 1))) {
    local_390.m_data[0] = local_390.m_data[0] >> 1;
    if (local_390.m_data[0] < 2) {
      local_390.m_data[0] = 1;
    }
    local_390.m_data[1] = local_390.m_data[1] >> 1;
    if (local_390.m_data[1] < 2) {
      local_390.m_data[1] = 1;
    }
    local_390.m_data[2] = local_390.m_data[2] >> 1;
    if (local_390.m_data[2] < 2) {
      local_390.m_data[2] = 1;
    }
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
              (&mipLevelSizes,&local_390);
  }
  local_380 = context;
  TVar12 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar6 = tcu::getPixelSize(TVar12);
  mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar20 = -(long)mipLevelSizes.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  for (pVVar17 = mipLevelSizes.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pVVar4 = mipLevelSizes.
               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
      pVVar17 !=
      mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pVVar17 = pVVar17 + 1) {
    resultImage.m_format =
         (TextureFormat)
         ((long)pVVar17->m_data[3] *
          (long)pVVar17->m_data[2] * (long)pVVar17->m_data[1] *
          (long)pVVar17->m_data[0] * (long)iVar6 + 0xfU & 0xfffffffffffffff0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&mipLevelStorageSizes,(unsigned_long *)&resultImage);
    lVar20 = lVar20 + -0x10;
  }
  format_00 = caseDef->depthStencilFormat;
  if ((format_00 != VK_FORMAT_UNDEFINED) &&
     (bVar5 = isDepthStencilFormatSupported(vki,physDevice,format_00), !bVar5)) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"Unsupported depth/stencil format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
               ,0x4ee);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = local_380;
  uVar18 = (ulong)-((long)pVVar4->m_data + lVar20) >> 4;
  sVar22 = 0;
  for (puVar13 = mipLevelStorageSizes.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puVar13 !=
      mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish; puVar13 = puVar13 + 1) {
    sVar22 = sVar22 + *puVar13;
  }
  pDVar11 = (DeviceInterface *)CONCAT71(uVar26,useStencil);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&resultImage,pDVar11,device,sVar22,2);
  local_d8.m_data.deleter.m_device = (VkDevice)resultImage._16_8_;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
  local_d8.m_data.object.m_internal._0_4_ = resultImage.m_format.order;
  local_d8.m_data.object.m_internal._4_4_ = resultImage.m_format.type;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
  resultImage._0_16_ = ZEXT816(0);
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&resultImage);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage,pDVar11,
             device,allocator,(VkBuffer)local_d8.m_data.object.m_internal,(MemoryRequirement)0x1);
  colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
       = (Allocation *)resultImage.m_format;
  auVar3._8_8_ = 0;
  auVar3._0_4_ = resultImage.m_size.m_data[0];
  auVar3._4_4_ = resultImage.m_size.m_data[1];
  resultImage._0_16_ = auVar3 << 0x40;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage);
  memset((colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
          m_data.ptr)->m_hostPtr,0,sVar22);
  ::vk::flushMappedMemoryRange
            (pDVar11,device,
             (VkDeviceMemory)
             ((colorBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.ptr)->m_offset,0xffffffffffffffff);
  pPVar2 = this_00->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textureLevel,"vert",(allocator<char> *)&vertices);
  pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&textureLevel);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,
             (DeviceInterface *)CONCAT71(uVar26,useStencil),device,pPVar14,0);
  local_58.m_data.deleter.m_device = (VkDevice)resultImage._16_8_;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
  local_58.m_data.object.m_internal._0_4_ = resultImage.m_format.order;
  local_58.m_data.object.m_internal._4_4_ = resultImage.m_format.type;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
  resultImage._0_16_ = ZEXT816(0);
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&resultImage);
  std::__cxx11::string::~string((string *)&textureLevel);
  pPVar2 = this_00->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textureLevel,"frag",(allocator<char> *)&vertices);
  pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&textureLevel);
  pDVar11 = (DeviceInterface *)CONCAT71(uVar26,useStencil);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar11,device,pPVar14,0);
  local_78.m_data.deleter.m_device = (VkDevice)resultImage._16_8_;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
  local_78.m_data.object.m_internal._0_4_ = resultImage.m_format.order;
  local_78.m_data.object.m_internal._4_4_ = resultImage.m_format.type;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
  resultImage._0_16_ = ZEXT816(0);
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&resultImage);
  std::__cxx11::string::~string((string *)&textureLevel);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&resultImage,pDVar11,device);
  local_98.m_data.deleter.m_device = (VkDevice)resultImage._16_8_;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
  local_98.m_data.object.m_internal._0_4_ = resultImage.m_format.order;
  local_98.m_data.object.m_internal._4_4_ = resultImage.m_format.type;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
  resultImage._0_16_ = ZEXT816(0);
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&resultImage);
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  depthStencilImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
       = (Allocation *)0x0;
  uVar24 = (ulong)caseDef->viewType;
  flags = (uint)(uVar24 == 2) * 0x20;
  VVar1 = flags + 0x10;
  if (uVar24 == 6) {
    flags = VVar1;
  }
  if (uVar24 == 3) {
    flags = VVar1;
  }
  if (uVar24 < 7) {
    imageType = *(VkImageType *)(&DAT_0098373c + uVar24 * 4);
  }
  else {
    imageType = VK_IMAGE_TYPE_LAST;
  }
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)imageSize.m_data._0_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(vertices.
                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,imageSize.m_data[2]);
  numMipLevels = (deUint32)uVar18;
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&textureLevel,
            (DeviceInterface *)CONCAT71(uVar26,useStencil),device,flags,imageType,
            caseDef->colorFormat,(IVec3 *)&vertices,numMipLevels,imageSize.m_data[3],0x11);
  resultImage.m_size.m_data[2] = textureLevel.m_size.m_data[2];
  resultImage.m_pitch.m_data[0] = textureLevel._20_4_;
  resultImage.m_pitch.m_data._4_8_ = textureLevel.m_data.m_ptr;
  resultImage.m_format = textureLevel.m_format;
  resultImage.m_size.m_data[0] = textureLevel.m_size.m_data[0];
  resultImage.m_size.m_data[1] = textureLevel.m_size.m_data[1];
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0;
  textureLevel._20_4_ = 0;
  textureLevel.m_data.m_ptr = (void *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)resultImage._16_8_;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._0_4_ =
       resultImage.m_format.order;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._4_4_ =
       resultImage.m_format.type;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)resultImage.m_size.m_data._0_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&textureLevel);
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage,
            (DeviceInterface *)CONCAT71(uVar26,useStencil),device,allocator,
            (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                     m_internal,(MemoryRequirement)0x0);
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  data.ptr._1_7_ = uVar26;
  data.ptr._0_1_ = useStencil;
  data._8_8_ = caseDef;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,
             data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage);
  if (format_00 != VK_FORMAT_UNDEFINED) {
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)imageSize.m_data._0_8_;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(vertices.
                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
    makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&textureLevel,
              (DeviceInterface *)CONCAT71(uVar26,useStencil),device,0,VK_IMAGE_TYPE_2D,
              caseDef->depthStencilFormat,(IVec3 *)&vertices,numMipLevels,dVar8,0x20);
    resultImage.m_size.m_data[2] = textureLevel.m_size.m_data[2];
    resultImage.m_pitch.m_data[0] = textureLevel._20_4_;
    resultImage.m_pitch.m_data._4_8_ = textureLevel.m_data.m_ptr;
    resultImage.m_format = textureLevel.m_format;
    resultImage.m_size.m_data[0] = textureLevel.m_size.m_data[0];
    resultImage.m_size.m_data[1] = textureLevel.m_size.m_data[1];
    textureLevel.m_format.order = R;
    textureLevel.m_format.type = SNORM_INT8;
    textureLevel.m_size.m_data[0] = 0;
    textureLevel.m_size.m_data[1] = 0;
    textureLevel.m_size.m_data[2] = 0;
    textureLevel._20_4_ = 0;
    textureLevel.m_data.m_ptr = (void *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
              (&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)resultImage._16_8_;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._0_4_ =
         resultImage.m_format.order;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._4_4_ =
         resultImage.m_format.type;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)resultImage.m_size.m_data._0_8_;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&textureLevel);
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage,
              (DeviceInterface *)CONCAT71(uVar26,useStencil),device,allocator,
              (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object
                       .m_internal,(MemoryRequirement)0x0);
    resultImage.m_format.order = R;
    resultImage.m_format.type = SNORM_INT8;
    data_00.ptr._1_7_ = uVar26;
    data_00.ptr._0_1_ = useStencil;
    data_00._8_8_ = caseDef;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
              (&depthStencilImageAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_00);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage);
  }
  genFullQuadVertices(&vertices,dVar8);
  sVar22 = (long)vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&textureLevel,
             (DeviceInterface *)CONCAT71(uVar26,useStencil),device,sVar22,0x80);
  resultImage.m_size.m_data[2] = textureLevel.m_size.m_data[2];
  resultImage.m_pitch.m_data[0] = textureLevel._20_4_;
  resultImage.m_pitch.m_data._4_8_ = textureLevel.m_data.m_ptr;
  resultImage.m_format = textureLevel.m_format;
  resultImage.m_size.m_data[0] = textureLevel.m_size.m_data[0];
  resultImage.m_size.m_data[1] = textureLevel.m_size.m_data[1];
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0;
  textureLevel._20_4_ = 0;
  textureLevel.m_data.m_ptr = (void *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)resultImage._16_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ =
       resultImage.m_format.order;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_ =
       resultImage.m_format.type;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)resultImage.m_size.m_data._0_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&textureLevel);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage,
             (DeviceInterface *)CONCAT71(uVar26,useStencil),device,allocator,
             (VkBuffer)
             vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  data_01.ptr._1_7_ = uVar26;
  data_01.ptr._0_1_ = useStencil;
  data_01._8_8_ = caseDef;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_01);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage);
  memcpy((vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
          m_data.ptr)->m_hostPtr,
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start,sVar22);
  pDVar11 = (DeviceInterface *)CONCAT71(uVar26,useStencil);
  ::vk::flushMappedMemoryRange
            (pDVar11,device,
             (VkDeviceMemory)
             ((vertexBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,sVar22);
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base(&vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               );
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&resultImage,pDVar11,device,2,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  textureLevel.m_size.m_data[2] = resultImage.m_size.m_data[2];
  textureLevel._20_4_ = resultImage.m_pitch.m_data[0];
  textureLevel.m_data.m_ptr = (void *)resultImage.m_pitch.m_data._4_8_;
  textureLevel.m_format = resultImage.m_format;
  textureLevel.m_size.m_data[0] = resultImage.m_size.m_data[0];
  textureLevel.m_size.m_data[1] = resultImage.m_size.m_data[1];
  resultImage._0_16_ = ZEXT816(0);
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&resultImage);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&resultImage,pDVar11,device,
                    (VkCommandPool)textureLevel.m_format);
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultImage._16_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)resultImage.m_format;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)resultImage.m_size.m_data._0_8_;
  resultImage._0_16_ = ZEXT816(0);
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&resultImage);
  beginCommandBuffer(pDVar11,(VkCommandBuffer)
                             vertices.
                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  resultImage.m_format.order = 0x2d;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0x100;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 2;
  resultImage.m_data = (void *)0xffffffffffffffff;
  getFormatAspectFlags(caseDef->depthStencilFormat);
  uVar24 = 0;
  (**(code **)(*(long *)CONCAT71(uVar26,useStencil) + 0x368))
            ((long *)CONCAT71(uVar26,useStencil),
             vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start,1,0x80,0,0,0,0,0,
             2 - (uint)(format_00 == VK_FORMAT_UNDEFINED),(int)&resultImage);
  VVar7 = (**(code **)(*(long *)CONCAT71(uVar26,useStencil) + 0x250))
                    ((long *)CONCAT71(uVar26,useStencil),
                     vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  ::vk::checkResult(VVar7,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                    ,0x557);
  submitCommandsAndWait
            ((DeviceInterface *)CONCAT71(uVar26,useStencil),device,queue,
             (VkCommandBuffer)
             vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&vertices);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&textureLevel);
  uVar19 = 0;
  uVar16 = 0;
  if (0 < (int)numMipLevels) {
    uVar16 = uVar18 & 0xffffffff;
  }
  while (vertexModule.m_internal = local_58.m_data.object.m_internal,
        fragmentModule.m_internal = local_78.m_data.object.m_internal,
        pipelineLayout.m_internal = local_98.m_data.object.m_internal,
        image_00.m_internal =
             depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,
        image.m_internal =
             colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
        pVVar17 = mipLevelSizes.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_start, uVar19 != uVar16) {
    numLayers = mipLevelSizes.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar19].m_data[3];
    if (mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar19].m_data[3] <
        mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar19].m_data[2]) {
      numLayers = mipLevelSizes.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar19].m_data[2];
    }
    local_e0 = vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    local_378 = uVar19;
    pDVar11 = Context::getDeviceInterface(this_00);
    device_00 = Context::getDevice(this_00);
    queue_00 = Context::getUniversalQueue(this_00);
    dVar8 = Context::getUniversalQueueFamilyIndex(this_00);
    VVar9 = getFormatAspectFlags(caseDef->depthStencilFormat);
    makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                   &((value_type *)&resultImage)->depthStencil,pDVar11,device_00,
                   caseDef->colorFormat,caseDef->depthStencilFormat,numLayers,
                   VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                   VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
    pVVar17 = pVVar17 + uVar19;
    textureLevel.m_size.m_data[2] = resultImage.m_size.m_data[2];
    textureLevel._20_4_ = resultImage.m_pitch.m_data[0];
    textureLevel.m_data.m_ptr = (void *)resultImage.m_pitch.m_data._4_8_;
    textureLevel.m_format = resultImage.m_format;
    textureLevel.m_size.m_data[0] = resultImage.m_size.m_data[0];
    textureLevel.m_size.m_data[1] = resultImage.m_size.m_data[1];
    resultImage._0_16_ = ZEXT816(0);
    resultImage.m_size.m_data[2] = 0;
    resultImage.m_pitch.m_data[0] = 0;
    resultImage.m_pitch.m_data[1] = 0;
    resultImage.m_pitch.m_data[2] = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)17>_> *)
               &((value_type *)&resultImage)->depthStencil);
    pipelines.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    colorAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pipelines.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pipelines.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depthStencilAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    colorAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    attachmentHandles.
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depthStencilAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depthStencilAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    attachmentHandles.
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    attachmentHandles.
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    basePipeline.m_internal = 0;
    VVar15 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    if (0 < (int)numLayers) {
      VVar15 = numLayers;
    }
    for (VVar23 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; VVar15 != VVar23;
        VVar23 = VVar23 + VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
      viewType = VK_IMAGE_VIEW_TYPE_LAST;
      if ((ulong)caseDef->viewType < 7) {
        viewType = *(VkImageViewType *)(&DAT_00983758 + (ulong)caseDef->viewType * 4);
      }
      subresourceRange.baseMipLevel = (int)local_378;
      subresourceRange.aspectMask = 1;
      subresourceRange.levelCount = 1;
      subresourceRange.baseArrayLayer = VVar23;
      subresourceRange.layerCount = 1;
      makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&vertices,pDVar11,device_00,
                    (VkImage)image.m_internal,viewType,caseDef->colorFormat,subresourceRange);
      pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
                ((_anonymous_namespace_ *)&((value_type *)&resultImage)->depthStencil,
                 (Move<vk::Handle<(vk::HandleType)13>_> *)&vertices);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                  *)&colorAttachments,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                 &((value_type *)&resultImage)->depthStencil);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                 &((value_type *)&resultImage)->depthStencil);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&vertices);
      std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ::push_back(&attachmentHandles,
                  (value_type *)
                  colorAttachments.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
      local_208._M_dataplus._M_p = *(pointer *)pVVar17->m_data;
      makeGraphicsPipeline
                ((Move<vk::Handle<(vk::HandleType)18>_> *)&regions,pDVar11,device_00,basePipeline,
                 (VkPipelineLayout)pipelineLayout.m_internal,(VkRenderPass)textureLevel.m_format,
                 (VkShaderModule)vertexModule.m_internal,(VkShaderModule)fragmentModule.m_internal,
                 (IVec2 *)&local_208,VVar23,(VVar9 & 2) >> 1,3 < VVar9,(bool)useStencil);
      pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)18>>
                ((_anonymous_namespace_ *)&((value_type *)&resultImage)->depthStencil,
                 (Move<vk::Handle<(vk::HandleType)18>_> *)&regions);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                  *)&pipelines,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                 &((value_type *)&resultImage)->depthStencil);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::release
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                 &((value_type *)&resultImage)->depthStencil);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&regions);
      basePipeline.m_internal =
           ((pipelines.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->m_ptr->
           super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
    }
    if (1 < VVar9) {
      for (VVar23 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; VVar15 != VVar23;
          VVar23 = VVar23 + VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
        res_1.baseMipLevel = (deUint32)local_378;
        res_1.levelCount = 1;
        subresourceRange_00.baseMipLevel = res_1.baseMipLevel;
        subresourceRange_00.aspectMask = VVar9;
        subresourceRange_00.levelCount = 1;
        subresourceRange_00.baseArrayLayer = VVar23;
        subresourceRange_00.layerCount = 1;
        res_1.aspectMask = VVar9;
        res_1.baseArrayLayer = VVar23;
        res_1.layerCount = res_1.levelCount;
        makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_208,pDVar11,device_00,
                      (VkImage)image_00.m_internal,VK_IMAGE_VIEW_TYPE_2D,caseDef->depthStencilFormat
                      ,subresourceRange_00);
        pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
                  ((_anonymous_namespace_ *)&((value_type *)&resultImage)->depthStencil,
                   (Move<vk::Handle<(vk::HandleType)13>_> *)&local_208);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                    *)&depthStencilAttachments,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   &((value_type *)&resultImage)->depthStencil);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   &((value_type *)&resultImage)->depthStencil);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&local_208);
        std::
        vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
        push_back(&attachmentHandles,
                  (value_type *)
                  depthStencilAttachments.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
      }
    }
    uVar24 = 0;
    makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)
                    &((value_type *)&resultImage)->depthStencil,pDVar11,device_00,
                    (VkRenderPass)textureLevel.m_format,
                    (deUint32)
                    ((ulong)((long)attachmentHandles.
                                   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)attachmentHandles.
                                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                    attachmentHandles.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,pVVar17->m_data[0],pVVar17->m_data[1],
                    1);
    format = resultImage.m_format;
    resultImage._0_16_ = ZEXT816(0);
    resultImage.m_size.m_data[2] = 0;
    resultImage.m_pitch.m_data[0] = 0;
    resultImage.m_pitch.m_data[1] = 0;
    resultImage.m_pitch.m_data[2] = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)23>_> *)
               &((value_type *)&resultImage)->depthStencil);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&((value_type *)&resultImage)->depthStencil,
               pDVar11,device_00,2,dVar8,(VkAllocationCallbacks *)0x0);
    this_00 = local_380;
    local_198.m_data.deleter.m_device = (VkDevice)resultImage._16_8_;
    local_198.m_data.deleter.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_
    ;
    local_198.m_data.object.m_internal._0_4_ = resultImage.m_format.order;
    local_198.m_data.object.m_internal._4_4_ = resultImage.m_format.type;
    local_198.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
    resultImage._0_16_ = ZEXT816(0);
    resultImage.m_size.m_data[2] = 0;
    resultImage.m_pitch.m_data[0] = 0;
    resultImage.m_pitch.m_data[1] = 0;
    resultImage.m_pitch.m_data[2] = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
               &((value_type *)&resultImage)->depthStencil);
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&((value_type *)&resultImage)->depthStencil,
                      pDVar11,device_00,(VkCommandPool)local_198.m_data.object.m_internal);
    local_328.m_data.deleter.m_device = (VkDevice)resultImage._16_8_;
    local_328.m_data.deleter.m_pool.m_internal._0_4_ = resultImage.m_pitch.m_data[1];
    local_328.m_data.deleter.m_pool.m_internal._4_4_ = resultImage.m_pitch.m_data[2];
    local_328.m_data.object = (VkCommandBuffer_s *)resultImage.m_format;
    local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
    resultImage._0_16_ = ZEXT816(0);
    resultImage.m_size.m_data[2] = 0;
    resultImage.m_pitch.m_data[0] = 0;
    resultImage.m_pitch.m_data[1] = 0;
    resultImage.m_pitch.m_data[2] = 0;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)&((value_type *)&resultImage)->depthStencil);
    beginCommandBuffer(pDVar11,local_328.m_data.object);
    resultImage._0_16_ = getClearValue(caseDef->colorFormat);
    std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
              (&clearValues,(long)(int)numLayers,(value_type *)&resultImage,
               (allocator_type *)&local_2c0);
    if (1 < VVar9) {
      resultImage.m_format.order = 0x3f800000;
      resultImage.m_format.type = UNSIGNED_INT24|UNORM_SHORT_4444;
      std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::insert
                (&clearValues,
                 (const_iterator)
                 clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(long)(int)numLayers,
                 (value_type *)&resultImage);
    }
    resultImage.m_format.order = 0x2b;
    resultImage.m_size.m_data[0] = 0;
    resultImage.m_size.m_data[1] = 0;
    resultImage.m_size.m_data[2] = textureLevel.m_format.order;
    resultImage.m_pitch.m_data[0] = textureLevel.m_format.type;
    resultImage.m_pitch.m_data[1] = format.order;
    resultImage.m_pitch.m_data[2] = format.type;
    resultImage.m_data = (void *)0x0;
    local_2c0 = 0;
    (*pDVar11->_vptr_DeviceInterface[0x74])
              (pDVar11,local_328.m_data.object,(value_type *)&resultImage,0);
    (*pDVar11->_vptr_DeviceInterface[0x58])(pDVar11,local_328.m_data.object,0,1,&local_e0);
    std::_Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~_Vector_base
              (&clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>)
    ;
    for (uVar19 = 0; (ulong)numLayers << 2 != uVar19; uVar19 = uVar19 + 4) {
      if (uVar19 != 0) {
        (*pDVar11->_vptr_DeviceInterface[0x75])(pDVar11,local_328.m_data.object,0);
      }
      (*pDVar11->_vptr_DeviceInterface[0x4c])
                (pDVar11,local_328.m_data.object,0,
                 **(undefined8 **)
                   ((long)&(pipelines.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar19 * 4));
      (*pDVar11->_vptr_DeviceInterface[0x59])
                (pDVar11,local_328.m_data.object,4,1,uVar19 & 0xffffffff);
    }
    (*pDVar11->_vptr_DeviceInterface[0x76])(pDVar11,local_328.m_data.object);
    VVar7 = (*pDVar11->_vptr_DeviceInterface[0x4a])(pDVar11,local_328.m_data.object);
    ::vk::checkResult(VVar7,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                      ,0x4d4);
    submitCommandsAndWait(pDVar11,device_00,queue_00,local_328.m_data.object);
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_328);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_198);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&format);
    std::
    _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    ~_Vector_base(&attachmentHandles.
                   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                 );
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::~vector(&depthStencilAttachments);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::~vector(&colorAttachments);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector(&pipelines);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&textureLevel);
    uVar19 = local_378 + 1;
  }
  pDVar11 = (DeviceInterface *)CONCAT71(uVar26,useStencil);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&resultImage,pDVar11,device,2,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  textureLevel.m_size.m_data[2] = resultImage.m_size.m_data[2];
  textureLevel._20_4_ = resultImage.m_pitch.m_data[0];
  textureLevel.m_data.m_ptr = (void *)resultImage.m_pitch.m_data._4_8_;
  textureLevel.m_format = resultImage.m_format;
  textureLevel.m_size.m_data[0] = resultImage.m_size.m_data[0];
  textureLevel.m_size.m_data[1] = resultImage.m_size.m_data[1];
  resultImage._0_16_ = ZEXT816(0);
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&resultImage);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&resultImage,pDVar11,device,
                    (VkCommandPool)textureLevel.m_format);
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultImage._16_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)resultImage.m_format;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)resultImage.m_size.m_data._0_8_;
  resultImage._0_16_ = ZEXT816(0);
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&resultImage);
  beginCommandBuffer(pDVar11,(VkCommandBuffer)
                             vertices.
                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  resultImage.m_format.order = 0x2d;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0x100;
  resultImage.m_pitch.m_data[0] = 0x800;
  resultImage.m_pitch.m_data[1] = 2;
  resultImage.m_pitch.m_data[2] = 6;
  resultImage.m_data = (void *)0xffffffffffffffff;
  uVar24 = uVar24 & 0xffffffff00000000;
  uVar16 = 0;
  (*pDVar11->_vptr_DeviceInterface[0x6d])
            (pDVar11,vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start,0x400,0x1000,0,0,0,uVar24,0,1,
             (int)&resultImage);
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resultImage._0_16_ = ZEXT816(0);
  resultImage.m_pitch.m_data._4_8_ = (ulong)(uint)imageSize.m_data[3] << 0x20;
  resultImage.m_size.m_data[2] = 1;
  resultImage.m_pitch.m_data[0] = 0;
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  resultImage.m_data = (void *)0x0;
  uVar18 = uVar18 & 0xffffffff;
  if ((int)numMipLevels < 1) {
    uVar18 = uVar16;
  }
  TVar12.order = R;
  TVar12.type = SNORM_INT8;
  for (; uVar25 = (undefined4)(uVar24 >> 0x20), uVar18 != uVar16; uVar16 = uVar16 + 1) {
    resultImage.m_format = TVar12;
    resultImage.m_pitch.m_data[0] = (int)uVar16;
    std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::push_back
              (&regions,(value_type *)&resultImage);
    TVar12 = (TextureFormat)
             ((long)TVar12 +
             mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar16]);
  }
  pDVar11 = (DeviceInterface *)CONCAT71(uVar26,useStencil);
  (*pDVar11->_vptr_DeviceInterface[99])
            (pDVar11,vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,
             local_d8.m_data.object.m_internal,
             ((long)regions.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)regions.
                   super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,
             (int)regions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::~_Vector_base
            (&regions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>);
  resultImage.m_format.order = 0x2c;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0x1000;
  resultImage.m_pitch.m_data[0] = 0x2000;
  resultImage.m_pitch.m_data[1] = -1;
  resultImage.m_pitch.m_data[2] = -1;
  resultImage.m_data = (void *)local_d8.m_data.object.m_internal;
  (*pDVar11->_vptr_DeviceInterface[0x6d])
            (pDVar11,vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start,0x1000,0x4000,0,0,0,
             CONCAT44(uVar25,1),(int)(value_type *)&resultImage,0,0);
  VVar7 = (*pDVar11->_vptr_DeviceInterface[0x4a])
                    (pDVar11,vertices.
                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  ::vk::checkResult(VVar7,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                    ,0x5b4);
  submitCommandsAndWait
            (pDVar11,device,queue,
             (VkCommandBuffer)
             vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&vertices);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&textureLevel);
  ::vk::invalidateMappedMemoryRange
            (pDVar11,device,
             (VkDeviceMemory)
             ((colorBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.ptr)->m_offset,0xffffffffffffffff);
  format = ::vk::mapVkFormat(caseDef->colorFormat);
  bVar21 = 1;
  CVar10 = R;
  lVar20 = 0;
  while( true ) {
    pVVar17 = mipLevelSizes.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    local_198.m_data.object.m_internal._0_4_ = CVar10;
    if ((int)numMipLevels <= (int)CVar10) break;
    iVar6 = mipLevelSizes.
            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
            super__Vector_impl_data._M_start[(int)CVar10].m_data[3];
    if (mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(int)CVar10].m_data[3] <
        mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(int)CVar10].m_data[2]) {
      iVar6 = mipLevelSizes.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_start[(int)CVar10].m_data[2];
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&resultImage,&format,
               mipLevelSizes.
               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[(int)CVar10].m_data[0],
               mipLevelSizes.
               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[(int)CVar10].m_data[1],iVar6,
               (void *)((long)(colorBufferAlloc.
                               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                               .m_data.ptr)->m_hostPtr + lVar20));
    pVVar17 = pVVar17 + (int)CVar10;
    tcu::TextureLevel::TextureLevel
              (&textureLevel,&format,pVVar17->m_data[0],pVVar17->m_data[1],iVar6);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&vertices,&textureLevel);
    de::toString<int>(&local_208,(int *)&local_198);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&regions,
                   "Mip level ",&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    local_208._M_dataplus._M_p = *(pointer *)pVVar17->m_data;
    generateExpectedImage((PixelBufferAccess *)&vertices,(IVec2 *)&local_208,0);
    bVar5 = ::vk::isFloatFormat(caseDef->colorFormat);
    imageSetDesc = regions.
                   super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    log = local_380->m_testCtx->m_log;
    if (bVar5) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_208,0.01);
      bVar5 = tcu::floatThresholdCompare
                        (log,"Image Comparison",(char *)imageSetDesc,
                         (ConstPixelBufferAccess *)&vertices,&resultImage,(Vec4 *)&local_208,
                         COMPARE_LOG_RESULT);
    }
    else {
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&local_208,2);
      bVar5 = tcu::intThresholdCompare
                        (log,"Image Comparison",(char *)imageSetDesc,
                         (ConstPixelBufferAccess *)&vertices,&resultImage,(UVec4 *)&local_208,
                         COMPARE_LOG_RESULT);
    }
    bVar21 = bVar21 & bVar5;
    lVar20 = lVar20 + mipLevelStorageSizes.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [(int)(ChannelOrder)local_198.m_data.object.m_internal];
    std::__cxx11::string::~string((string *)&regions);
    tcu::TextureLevel::~TextureLevel(&textureLevel);
    CVar10 = (ChannelOrder)local_198.m_data.object.m_internal + A;
  }
  if (bVar21 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultImage,"Fail",(allocator<char> *)&textureLevel);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&resultImage);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultImage,"Pass",(allocator<char> *)&textureLevel);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&resultImage);
  }
  std::__cxx11::string::~string((string *)&resultImage);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&depthStencilImageAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>)
  ;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_98);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_58);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
            );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_d8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&mipLevelSizes.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testRenderToMipMaps (Context& context, const CaseDef caseDef)
{
	checkImageViewTypeRequirements(context, caseDef.viewType);

	const DeviceInterface&			vk					= context.getDeviceInterface();
	const InstanceInterface&		vki					= context.getInstanceInterface();
	const VkDevice					device				= context.getDevice();
	const VkPhysicalDevice			physDevice			= context.getPhysicalDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	const IVec4						imageSize				= caseDef.imageSizeHint;	// MAX_SIZE is not used in this test
	const deInt32					numSlices				= maxLayersOrDepth(imageSize);
	const vector<IVec4>				mipLevelSizes			= getMipLevelSizes(imageSize);
	const vector<VkDeviceSize>		mipLevelStorageSizes	= getPerMipLevelStorageSize(mipLevelSizes, tcu::getPixelSize(mapVkFormat(caseDef.colorFormat)));
	const int						numMipLevels			= static_cast<int>(mipLevelSizes.size());
	const bool						useDepthStencil			= (caseDef.depthStencilFormat != VK_FORMAT_UNDEFINED);

	if (useDepthStencil && !isDepthStencilFormatSupported(vki, physDevice, caseDef.depthStencilFormat))
		TCU_THROW(NotSupportedError, "Unsupported depth/stencil format");

	// Create a color buffer big enough to hold all layers and mip levels
	const VkDeviceSize				colorBufferSize		= sum(mipLevelStorageSizes);
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	{
		deMemset(colorBufferAlloc->getHostPtr(), 0, static_cast<std::size_t>(colorBufferSize));
		flushMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
	}

	const Unique<VkShaderModule>	vertexModule		(createShaderModule	(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	fragmentModule		(createShaderModule	(vk, device, context.getBinaryCollection().get("frag"), 0u));
	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout	(vk, device));

	Move<VkImage>					colorImage;
	MovePtr<Allocation>				colorImageAlloc;
	Move<VkImage>					depthStencilImage;
	MovePtr<Allocation>				depthStencilImageAlloc;
	Move<VkBuffer>					vertexBuffer;
	MovePtr<Allocation>				vertexBufferAlloc;

	// Create a color image
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

		colorImage		= makeImage(vk, device, getImageCreateFlags(caseDef.viewType), getImageType(caseDef.viewType), caseDef.colorFormat,
									imageSize.swizzle(0, 1, 2), numMipLevels, imageSize.w(), imageUsage);
		colorImageAlloc	= bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any);
	}

	// Create a depth/stencil image (always a 2D image, optionally layered)
	if (useDepthStencil)
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;

		depthStencilImage		= makeImage(vk, device, (VkImageCreateFlags)0, VK_IMAGE_TYPE_2D, caseDef.depthStencilFormat,
											IVec3(imageSize.x(), imageSize.y(), 1), numMipLevels, numSlices, imageUsage);
		depthStencilImageAlloc	= bindImage(vk, device, allocator, *depthStencilImage, MemoryRequirement::Any);
	}

	// Create a vertex buffer
	{
		const vector<Vertex4RGBA>	vertices			= genFullQuadVertices(numSlices);
		const VkDeviceSize			vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);
		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// Prepare images
	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);

		const VkImageMemoryBarrier	imageBarriers[]	=
		{
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType            sType;
				DE_NULL,											// const void*                pNext;
				(VkAccessFlags)0,									// VkAccessFlags              srcAccessMask;
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags              dstAccessMask;
				VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout              oldLayout;
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout              newLayout;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   dstQueueFamilyIndex;
				*colorImage,										// VkImage                    image;
				{													// VkImageSubresourceRange    subresourceRange;
					VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags    aspectMask;
					0u,													// uint32_t              baseMipLevel;
					static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
					0u,													// uint32_t              baseArrayLayer;
					static_cast<deUint32>(imageSize.w()),				// uint32_t              layerCount;
				},
			},
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType            sType;
				DE_NULL,											// const void*                pNext;
				(VkAccessFlags)0,									// VkAccessFlags              srcAccessMask;
				VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags              dstAccessMask;
				VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout              oldLayout;
				VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout              newLayout;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   dstQueueFamilyIndex;
				*depthStencilImage,									// VkImage                    image;
				{													// VkImageSubresourceRange    subresourceRange;
					getFormatAspectFlags(caseDef.depthStencilFormat),	// VkImageAspectFlags    aspectMask;
					0u,													// uint32_t              baseMipLevel;
					static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
					0u,													// uint32_t              baseArrayLayer;
					static_cast<deUint32>(numSlices),					// uint32_t              layerCount;
				},
			}
		};

		const deUint32	numImageBarriers = static_cast<deUint32>(DE_LENGTH_OF_ARRAY(imageBarriers) - (useDepthStencil ? 0 : 1));

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
								0u, DE_NULL, 0u, DE_NULL, numImageBarriers, imageBarriers);

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Draw
	for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
	{
		const IVec4&	mipSize		= mipLevelSizes[mipLevel];
		const int		levelSlices	= maxLayersOrDepth(mipSize);

		drawToMipLevel (context, caseDef, mipLevel, mipSize, levelSlices, *colorImage, *depthStencilImage, *vertexBuffer, *pipelineLayout,
						*vertexModule, *fragmentModule);
	}

	// Copy results: colorImage -> host visible colorBuffer
	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);

		{
			const VkImageMemoryBarrier	imageBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType            sType;
					DE_NULL,										// const void*                pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags              srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags              dstAccessMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout              oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,			// VkImageLayout              newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t                   srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t                   dstQueueFamilyIndex;
					*colorImage,									// VkImage                    image;
					{												// VkImageSubresourceRange    subresourceRange;
						VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags    aspectMask;
						0u,													// uint32_t              baseMipLevel;
						static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
						0u,													// uint32_t              baseArrayLayer;
						static_cast<deUint32>(imageSize.w()),				// uint32_t              layerCount;
					},
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
									0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(imageBarriers), imageBarriers);
		}
		{
			vector<VkBufferImageCopy>	regions;
			VkDeviceSize				levelOffset = 0ull;
			VkBufferImageCopy			workRegion	=
			{
				0ull,																				// VkDeviceSize                bufferOffset;
				0u,																					// uint32_t                    bufferRowLength;
				0u,																					// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, imageSize.w()),		// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),																// VkOffset3D                  imageOffset;
				makeExtent3D(0, 0, 0),																// VkExtent3D                  imageExtent;
			};

			for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
			{
				workRegion.bufferOffset					= levelOffset;
				workRegion.imageSubresource.mipLevel	= static_cast<deUint32>(mipLevel);
				workRegion.imageExtent					= makeExtent3D(mipLevelSizes[mipLevel].swizzle(0, 1, 2));

				regions.push_back(workRegion);

				levelOffset += mipLevelStorageSizes[mipLevel];
			}

			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, static_cast<deUint32>(regions.size()), &regions[0]);
		}
		{
			const VkBufferMemoryBarrier	bufferBarriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
									0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify results (per mip level)
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);

		const tcu::TextureFormat			format			= mapVkFormat(caseDef.colorFormat);

		VkDeviceSize						levelOffset		= 0ull;
		bool								allOk			= true;

		for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
		{
			const IVec4&						mipSize			= mipLevelSizes[mipLevel];
			const void*	const					pLevelData		= static_cast<const deUint8*>(colorBufferAlloc->getHostPtr()) + levelOffset;
			const int							levelDepth		= maxLayersOrDepth(mipSize);
			const tcu::ConstPixelBufferAccess	resultImage		(format, mipSize.x(), mipSize.y(), levelDepth, pLevelData);
			tcu::TextureLevel					textureLevel	(format, mipSize.x(), mipSize.y(), levelDepth);
			const tcu::PixelBufferAccess		expectedImage	= textureLevel.getAccess();
			const std::string					comparisonName	= "Mip level " + de::toString(mipLevel);
			bool								ok				= false;

			generateExpectedImage(expectedImage, mipSize.swizzle(0, 1), 0);

			if (isFloatFormat(caseDef.colorFormat))
				ok = tcu::floatThresholdCompare(context.getTestContext().getLog(), "Image Comparison", comparisonName.c_str(), expectedImage, resultImage, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);
			else
				ok = tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", comparisonName.c_str(), expectedImage, resultImage, tcu::UVec4(2), tcu::COMPARE_LOG_RESULT);

			allOk		=  allOk && ok;	// keep testing all levels, even if we know it's a fail overall
			levelOffset += mipLevelStorageSizes[mipLevel];
		}

		return allOk ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Fail");
	}
}